

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<unsigned_int>::erase(vector<unsigned_int> *this,uint *pFirst,uint *pEnd)

{
  bool bVar1;
  vector<unsigned_int> *pvVar2;
  uint *puVar3;
  long lVar4;
  vector<unsigned_int> *in_RDX;
  vector<unsigned_int> *in_RSI;
  vector<unsigned_int> *in_RDI;
  int64_t n;
  int64_t ofs;
  vector<unsigned_int> *in_stack_ffffffffffffffb8;
  vector<unsigned_int> *this_00;
  
  if (in_RDX < in_RSI) {
    __assert_fail("pFirst <= pEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x318,"void basisu::vector<unsigned int>::erase(T *, T *) [T = unsigned int]");
  }
  this_00 = in_RSI;
  pvVar2 = (vector<unsigned_int> *)begin(in_RDI);
  bVar1 = false;
  if (pvVar2 <= this_00) {
    in_stack_ffffffffffffffb8 = in_RSI;
    pvVar2 = (vector<unsigned_int> *)end(in_RDI);
    bVar1 = in_stack_ffffffffffffffb8 <= pvVar2;
  }
  if (!bVar1) {
    __assert_fail("pFirst >= begin() && pFirst <= end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x319,"void basisu::vector<unsigned int>::erase(T *, T *) [T = unsigned int]");
  }
  pvVar2 = (vector<unsigned_int> *)begin(in_RDI);
  bVar1 = false;
  if (pvVar2 <= in_RDX) {
    pvVar2 = (vector<unsigned_int> *)end(in_RDI);
    bVar1 = in_RDX <= pvVar2;
  }
  if (!bVar1) {
    __assert_fail("pEnd >= begin() && pEnd <= end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x31a,"void basisu::vector<unsigned int>::erase(T *, T *) [T = unsigned int]");
  }
  puVar3 = begin(in_RDI);
  lVar4 = (long)in_RSI - (long)puVar3 >> 2;
  if ((lVar4 < 0) || (0xffffffff < lVar4)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,799,"void basisu::vector<unsigned int>::erase(T *, T *) [T = unsigned int]");
  }
  lVar4 = (long)in_RDX - (long)in_RSI >> 2;
  if ((-1 < lVar4) && (lVar4 < 0x100000000)) {
    erase(this_00,(uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
          (uint32_t)in_stack_ffffffffffffffb8);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x326,"void basisu::vector<unsigned int>::erase(T *, T *) [T = unsigned int]");
}

Assistant:

inline void erase(T *pFirst, T *pEnd)
      {
         assert(pFirst <= pEnd);
         assert(pFirst >= begin() && pFirst <= end());
         assert(pEnd >= begin() && pEnd <= end());

         int64_t ofs = pFirst - begin();
         if ((ofs < 0) || (ofs > UINT32_MAX))
         {
            assert(0);
            return;
         }

         int64_t n = pEnd - pFirst;
         if ((n < 0) || (n > UINT32_MAX))
         {
            assert(0);
            return;
         }

         erase((uint32_t)ofs, (uint32_t)n);
      }